

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_263068::ECCurveTest_SetAffine_Test::TestBody(ECCurveTest_SetAffine_Test *this)

{
  bool bVar1;
  int iVar2;
  ParamType_conflict *pPVar3;
  pointer peVar4;
  char *pcVar5;
  BIGNUM *pBVar6;
  EC_GROUP *pEVar7;
  EC_POINT *p_00;
  BIGNUM *pBVar8;
  pointer peVar9;
  BIGNUM *pBVar10;
  char *in_R9;
  string local_4a8;
  AssertHelper local_488;
  Message local_480;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_440;
  Message local_438;
  bool local_429;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_3f8;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3b0;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_320;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__10;
  UniquePtr<EC_POINT> invalid_point;
  AssertHelper local_2d8;
  Message local_2d0;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<EC_POINT> point;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<BIGNUM> p;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<BIGNUM> y;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<BIGNUM> x;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EC_KEY> key;
  ECCurveTest_SetAffine_Test *this_local;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  peVar4 = (pointer)EC_KEY_new_by_curve_name(*pPVar3);
  std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&gtest_ar_.message_,peVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x223,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = EC_KEY_generate_key((EC_KEY *)peVar4);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&x,(internal *)local_80,
                 (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x224,pcVar5);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&x);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pBVar6 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (pointer)pBVar6);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&y,(internal *)local_d0,(AssertionResult *)0x89f0a1,"false","true",
                   in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x228,pcVar5);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&y);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pBVar6 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (pointer)pBVar6);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&p,(internal *)local_118,(AssertionResult *)0x8b2697,"false","true",
                     in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x22a,pcVar5);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&p);
          testing::Message::~Message(&local_120);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pBVar6 = BN_new();
          std::unique_ptr<bignum_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (pointer)pBVar6);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_160,
                       (AssertionResult *)0x857c63,"false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x22c,pcVar5);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
            peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            p_00 = EC_KEY_get0_public_key((EC_KEY *)peVar4);
            pBVar6 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar__2.message_);
            pBVar8 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar__3.message_);
            local_1a4 = EC_POINT_get_affine_coordinates_GFp
                                  ((EC_GROUP *)pEVar7,p_00,pBVar6,pBVar8,(BN_CTX *)0x0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                         (AssertionResult *)
                         "EC_POINT_get_affine_coordinates_GFp( group(), EC_KEY_get0_public_key(key.get()), x.get(), y.get(), nullptr)"
                         ,"false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x22e,pcVar5);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
            pBVar6 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar__4.message_);
            local_1ec = EC_GROUP_get_curve_GFp
                                  ((EC_GROUP *)pEVar7,pBVar6,(BIGNUM *)0x0,(BIGNUM *)0x0,
                                   (BN_CTX *)0x0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
            if (!bVar1) {
              testing::Message::Message(&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&point,(internal *)local_1e8,
                         (AssertionResult *)
                         "EC_GROUP_get_curve_GFp(group(), p.get(), nullptr, nullptr, nullptr)",
                         "false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_200,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x230,pcVar5);
              testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
              testing::internal::AssertHelper::~AssertHelper(&local_200);
              std::__cxx11::string::~string((string *)&point);
              testing::Message::~Message(&local_1f8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
            pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
            peVar9 = (pointer)EC_POINT_new((EC_GROUP *)pEVar7);
            std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                       peVar9);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_238,
                       (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
            if (!bVar1) {
              testing::Message::Message(&local_240);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8.message_,(internal *)local_238,
                         (AssertionResult *)0x83ed7a,"false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_248,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x234,pcVar5);
              testing::internal::AssertHelper::operator=(&local_248,&local_240);
              testing::internal::AssertHelper::~AssertHelper(&local_248);
              std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_240);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
              peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__7.message_);
              pBVar6 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              pBVar8 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              local_27c = EC_POINT_set_affine_coordinates_GFp
                                    ((EC_GROUP *)pEVar7,(EC_POINT *)peVar9,pBVar6,pBVar8,
                                     (BN_CTX *)0x0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_278,&local_27c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
              if (!bVar1) {
                testing::Message::Message(&local_288);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__9.message_,(internal *)local_278,
                           (AssertionResult *)
                           "EC_POINT_set_affine_coordinates_GFp(group(), point.get(), x.get(), y.get(), nullptr)"
                           ,"false","true",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_290,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x236,pcVar5);
                testing::internal::AssertHelper::operator=(&local_290,&local_288);
                testing::internal::AssertHelper::~AssertHelper(&local_290);
                std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                testing::Message::~Message(&local_288);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
              pBVar6 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              pBVar8 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              pBVar10 = BN_value_one();
              local_2c4 = BN_sub(pBVar6,pBVar8,pBVar10);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_2c0,&local_2c4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
              if (!bVar1) {
                testing::Message::Message(&local_2d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&invalid_point,(internal *)local_2c0,
                           (AssertionResult *)"BN_sub(y.get(), y.get(), BN_value_one())","false",
                           "true",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2d8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x239,pcVar5);
                testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                std::__cxx11::string::~string((string *)&invalid_point);
                testing::Message::~Message(&local_2d0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
              pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
              peVar9 = (pointer)EC_POINT_new((EC_GROUP *)pEVar7);
              std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar__10.message_,
                         peVar9);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_310,
                         (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__10.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
              if (!bVar1) {
                testing::Message::Message(&local_318);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__11.message_,(internal *)local_310,
                           (AssertionResult *)"invalid_point","false","true",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_320,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x23d,pcVar5);
                testing::internal::AssertHelper::operator=(&local_320,&local_318);
                testing::internal::AssertHelper::~AssertHelper(&local_320);
                std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                testing::Message::~Message(&local_318);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
                peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__10.message_);
                pBVar6 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__2.message_);
                pBVar8 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                iVar2 = EC_POINT_set_affine_coordinates_GFp
                                  ((EC_GROUP *)pEVar7,(EC_POINT *)peVar9,pBVar6,pBVar8,(BN_CTX *)0x0
                                  );
                local_351 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_350,&local_351,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_350);
                if (!bVar1) {
                  testing::Message::Message(&local_360);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__12.message_,(internal *)local_350,
                             (AssertionResult *)
                             "EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(), x.get(), y.get(), nullptr)"
                             ,"true","false",in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_368,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x23f,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_368,&local_360);
                  testing::internal::AssertHelper::~AssertHelper(&local_368);
                  std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                  testing::Message::~Message(&local_360);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                pBVar6 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                pBVar8 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                pBVar10 = BN_value_one();
                local_39c = BN_add(pBVar6,pBVar8,pBVar10);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_398,&local_39c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_398);
                if (!bVar1) {
                  testing::Message::Message(&local_3a8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__13.message_,(internal *)local_398,
                             (AssertionResult *)"BN_add(y.get(), y.get(), BN_value_one())","false",
                             "true",in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_3b0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x242,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
                  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                  std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                  testing::Message::~Message(&local_3a8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                pBVar6 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                pBVar8 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                pBVar10 = (BIGNUM *)
                          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
                local_3e4 = BN_add(pBVar6,pBVar8,pBVar10);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_3e0,&local_3e4,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_3e0);
                if (!bVar1) {
                  testing::Message::Message(&local_3f0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__14.message_,(internal *)local_3e0,
                             (AssertionResult *)"BN_add(y.get(), y.get(), p.get())","false","true",
                             in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_3f8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x243,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
                  testing::internal::AssertHelper::~AssertHelper(&local_3f8);
                  std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                  testing::Message::~Message(&local_3f0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
                pEVar7 = ECCurveTest::group(&this->super_ECCurveTest);
                peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__10.message_);
                pBVar6 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__2.message_);
                pBVar8 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                iVar2 = EC_POINT_set_affine_coordinates_GFp
                                  ((EC_GROUP *)pEVar7,(EC_POINT *)peVar9,pBVar6,pBVar8,(BN_CTX *)0x0
                                  );
                local_429 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_428,&local_429,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_428);
                if (!bVar1) {
                  testing::Message::Message(&local_438);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__15.message_,(internal *)local_428,
                             (AssertionResult *)
                             "EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(), x.get(), y.get(), nullptr)"
                             ,"true","false",in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_440,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x246,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_440,&local_438);
                  testing::internal::AssertHelper::~AssertHelper(&local_440);
                  std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                  testing::Message::~Message(&local_438);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
                peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                pBVar6 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__2.message_);
                pBVar8 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                iVar2 = EC_KEY_set_public_key_affine_coordinates((EC_KEY *)peVar4,pBVar6,pBVar8);
                local_471 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_470,&local_471,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_470);
                if (!bVar1) {
                  testing::Message::Message(&local_480);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_4a8,(internal *)local_470,
                             (AssertionResult *)
                             "EC_KEY_set_public_key_affine_coordinates(key.get(), x.get(), y.get())"
                             ,"true","false",in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_488,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x248,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_488,&local_480);
                  testing::internal::AssertHelper::~AssertHelper(&local_488);
                  std::__cxx11::string::~string((string *)&local_4a8);
                  testing::Message::~Message(&local_480);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ = 0;
              }
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__10.message_)
              ;
            }
            std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(ECCurveTest, SetAffine) {
  // Generate an EC_KEY.
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  // Get the public key's coordinates.
  bssl::UniquePtr<BIGNUM> x(BN_new());
  ASSERT_TRUE(x);
  bssl::UniquePtr<BIGNUM> y(BN_new());
  ASSERT_TRUE(y);
  bssl::UniquePtr<BIGNUM> p(BN_new());
  ASSERT_TRUE(p);
  EXPECT_TRUE(EC_POINT_get_affine_coordinates_GFp(
      group(), EC_KEY_get0_public_key(key.get()), x.get(), y.get(), nullptr));
  EXPECT_TRUE(
      EC_GROUP_get_curve_GFp(group(), p.get(), nullptr, nullptr, nullptr));

  // Points on the curve should be accepted.
  auto point = bssl::UniquePtr<EC_POINT>(EC_POINT_new(group()));
  ASSERT_TRUE(point);
  EXPECT_TRUE(EC_POINT_set_affine_coordinates_GFp(group(), point.get(), x.get(),
                                                  y.get(), nullptr));

  // Subtract one from |y| to make the point no longer on the curve.
  EXPECT_TRUE(BN_sub(y.get(), y.get(), BN_value_one()));

  // Points not on the curve should be rejected.
  bssl::UniquePtr<EC_POINT> invalid_point(EC_POINT_new(group()));
  ASSERT_TRUE(invalid_point);
  EXPECT_FALSE(EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(),
                                                   x.get(), y.get(), nullptr));

  // Coordinates out of range should be rejected.
  EXPECT_TRUE(BN_add(y.get(), y.get(), BN_value_one()));
  EXPECT_TRUE(BN_add(y.get(), y.get(), p.get()));

  EXPECT_FALSE(EC_POINT_set_affine_coordinates_GFp(group(), invalid_point.get(),
                                                   x.get(), y.get(), nullptr));
  EXPECT_FALSE(
      EC_KEY_set_public_key_affine_coordinates(key.get(), x.get(), y.get()));
}